

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf_fuzzer.cc
# Opt level: O3

shared_ptr<QPDF> __thiscall FuzzHelper::getQpdf(FuzzHelper *this)

{
  _Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_> this_00;
  BufferInputSource *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  Buffer *in_RSI;
  shared_ptr<QPDF> sVar2;
  shared_ptr<InputSource> is;
  shared_ptr<InputSource> local_68;
  BufferInputSource *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  string local_48;
  
  this_01 = (BufferInputSource *)operator_new(0xe8);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"fuzz input","");
  BufferInputSource::BufferInputSource(this_01,&local_48,in_RSI,false);
  local_58 = this_01;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<BufferInputSource*>
            (&local_50,this_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  QPDF::create();
  QPDF::setMaxWarnings
            ((QPDF *)(this->input_buffer).m._M_t.
                     super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>
                     .super__Head_base<0UL,_Buffer::Members_*,_false>,200);
  this_00.super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl =
       (this->input_buffer).m._M_t.
       super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
       super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
       super__Head_base<0UL,_Buffer::Members_*,_false>;
  local_68.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_58->super_InputSource;
  local_68.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_50._M_pi;
  if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
    }
  }
  QPDF::processInputSource
            ((QPDF *)this_00.super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl,&local_68,
             (char *)0x0);
  _Var1._M_pi = extraout_RDX;
  if (local_68.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
    _Var1._M_pi = extraout_RDX_01;
  }
  sVar2.super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<QPDF>)sVar2.super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QPDF>
FuzzHelper::getQpdf()
{
    auto is =
        std::shared_ptr<InputSource>(new BufferInputSource("fuzz input", &this->input_buffer));
    auto qpdf = QPDF::create();
    qpdf->setMaxWarnings(200);
    qpdf->processInputSource(is);
    return qpdf;
}